

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O3

int nghttp3_qpack_decoder_set_max_dtable_capacity
              (nghttp3_qpack_decoder *decoder,size_t max_dtable_capacity)

{
  nghttp3_mem *mem;
  size_t sVar1;
  long *ptr;
  undefined8 *puVar2;
  int iVar3;
  
  iVar3 = -0x65;
  if (max_dtable_capacity <= (decoder->ctx).hard_max_dtable_capacity) {
    mem = (decoder->ctx).mem;
    (decoder->ctx).max_dtable_capacity = max_dtable_capacity;
    iVar3 = 0;
    while (max_dtable_capacity < (decoder->ctx).dtable_size) {
      sVar1 = (decoder->ctx).dtable.len;
      if (sVar1 == 0) {
        __assert_fail("i",
                      "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                      ,0xc3e,
                      "int nghttp3_qpack_decoder_set_max_dtable_capacity(nghttp3_qpack_decoder *, size_t)"
                     );
      }
      puVar2 = (undefined8 *)nghttp3_ringbuf_get((nghttp3_ringbuf *)decoder,sVar1 - 1);
      ptr = (long *)*puVar2;
      (decoder->ctx).dtable_size =
           ((decoder->ctx).dtable_size - (*(long *)(*ptr + 0x10) + *(long *)(ptr[1] + 0x10))) - 0x20
      ;
      nghttp3_ringbuf_pop_back((nghttp3_ringbuf *)decoder);
      nghttp3_rcbuf_decref((nghttp3_rcbuf *)ptr[1]);
      nghttp3_rcbuf_decref((nghttp3_rcbuf *)*ptr);
      nghttp3_mem_free(mem,ptr);
    }
  }
  return iVar3;
}

Assistant:

int nghttp3_qpack_decoder_set_max_dtable_capacity(
  nghttp3_qpack_decoder *decoder, size_t max_dtable_capacity) {
  nghttp3_qpack_entry *ent;
  size_t i;
  nghttp3_qpack_context *ctx = &decoder->ctx;
  const nghttp3_mem *mem = ctx->mem;

  if (max_dtable_capacity > decoder->ctx.hard_max_dtable_capacity) {
    return NGHTTP3_ERR_INVALID_ARGUMENT;
  }

  ctx->max_dtable_capacity = max_dtable_capacity;

  while (ctx->dtable_size > max_dtable_capacity) {
    i = nghttp3_ringbuf_len(&ctx->dtable);
    assert(i);
    ent = *(nghttp3_qpack_entry **)nghttp3_ringbuf_get(&ctx->dtable, i - 1);

    ctx->dtable_size -= table_space(ent->nv.name->len, ent->nv.value->len);

    nghttp3_ringbuf_pop_back(&ctx->dtable);
    nghttp3_qpack_entry_free(ent);
    nghttp3_mem_free(mem, ent);
  }

  return 0;
}